

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O0

TeamType RenX::getTeam(int teamNum)

{
  undefined4 local_c;
  int teamNum_local;
  
  if (teamNum == 0) {
    local_c = GDI;
  }
  else if (teamNum == 1) {
    local_c = Nod;
  }
  else if (teamNum == 0xff) {
    local_c = None;
  }
  else {
    local_c = Other;
  }
  return local_c;
}

Assistant:

RenX::TeamType RenX::getTeam(int teamNum)
{
	switch (teamNum)
	{
	case 0:
		return RenX::TeamType::GDI;
	case 1:
		return RenX::TeamType::Nod;
	case 255:
		return RenX::TeamType::None;
	default:
		return RenX::TeamType::Other;
	}
}